

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::EntryGetOwnPropertyDescriptors
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  uint uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  CallFlags e;
  TypeId TVar6;
  uint32 uVar7;
  BOOL BVar8;
  PropertyId PVar9;
  ScriptContext *pSVar10;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar11;
  JavascriptLibrary *pJVar12;
  RecyclableObject *aRight;
  JavascriptArray *this_00;
  Var pvVar13;
  Var newDescriptor;
  PropertyRecord *propertyRecord;
  BOOL getPropResult;
  uint i;
  Var propKey;
  PropertyDescriptor propDesc;
  RecyclableObject *resultObj;
  JavascriptArray *ownPropertyKeys;
  CallInfo local_60;
  Var result;
  RecyclableObject *obj;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar10 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar10);
  pSVar10 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar10,(PVOID)0x0);
  iVar5 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar5);
  args.super_Arguments.Values = (Type)function_local;
  bVar4 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x2d7,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  obj = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar4 = operator!(e);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x2da,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  result = (Var)0x0;
  if (((uint)scriptContext & 0xffffff) < 2) {
    pJVar12 = ScriptContext::GetLibrary((ScriptContext *)obj);
    aRight = JavascriptLibraryBase::GetUndefined(&pJVar12->super_JavascriptLibraryBase);
    result = Js::JavascriptOperators::ToObject(aRight,(ScriptContext *)obj);
  }
  else {
    pvVar13 = Arguments::operator[]((Arguments *)&scriptContext,1);
    result = Js::JavascriptOperators::ToObject(pvVar13,(ScriptContext *)obj);
  }
  TVar6 = RecyclableObject::GetTypeId((RecyclableObject *)result);
  pvVar13 = result;
  if (TVar6 == TypeIds_HostDispatch) {
    Arguments::Arguments((Arguments *)&ownPropertyKeys,(Arguments *)&scriptContext);
    iVar5 = (**(code **)(*pvVar13 + 0x2a8))
                      (pvVar13,EntryGetOwnPropertyDescriptors,&ownPropertyKeys,&local_60);
    if (iVar5 != 0) {
      return (Var)local_60;
    }
  }
  this_00 = Js::JavascriptOperators::GetOwnPropertyKeys(result,(ScriptContext *)obj);
  pJVar12 = ScriptContext::GetLibrary((ScriptContext *)obj);
  uVar7 = ArrayObject::GetLength(&this_00->super_ArrayObject);
  propDesc._40_8_ = JavascriptLibrary::CreateObject(pJVar12,true,(PropertyIndex)uVar7);
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propKey);
  _getPropResult = (Var)0x0;
  propertyRecord._4_4_ = 0;
  do {
    uVar2 = propertyRecord._4_4_;
    uVar7 = ArrayObject::GetLength(&this_00->super_ArrayObject);
    if (uVar7 <= uVar2) {
      return (Var)propDesc._40_8_;
    }
    propertyRecord._0_4_ =
         Js::JavascriptArray::DirectGetItemAt<void*>
                   (this_00,propertyRecord._4_4_,(void **)&getPropResult);
    if ((BOOL)propertyRecord == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                  ,0x2fb,"(getPropResult)","getPropResult");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar11 = 0;
    }
    if ((BOOL)propertyRecord != 0) {
      JavascriptConversion::ToPropertyKey
                (_getPropResult,(ScriptContext *)obj,(PropertyRecord **)&newDescriptor,
                 (PropertyString **)0x0);
      pvVar13 = GetOwnPropertyDescriptorHelper
                          ((RecyclableObject *)result,_getPropResult,(ScriptContext *)obj);
      BVar8 = Js::JavascriptOperators::IsUndefined(pvVar13);
      uVar3 = propDesc._40_8_;
      if (BVar8 == 0) {
        PVar9 = PropertyRecord::GetPropertyId((PropertyRecord *)newDescriptor);
        (**(code **)(*(long *)uVar3 + 0xb8))(uVar3,PVar9,pvVar13,0,0);
      }
    }
    propertyRecord._4_4_ = propertyRecord._4_4_ + 1;
  } while( true );
}

Assistant:

Var JavascriptObject::EntryGetOwnPropertyDescriptors(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    RecyclableObject* obj = nullptr;

    if (args.Info.Count < 2)
    {
        obj = JavascriptOperators::ToObject(scriptContext->GetLibrary()->GetUndefined(), scriptContext);
    }
    else
    {
        // Convert the argument to object first
        obj = JavascriptOperators::ToObject(args[1], scriptContext);
    }

    // If the object is HostDispatch try to invoke the operation remotely
    if (obj->GetTypeId() == TypeIds_HostDispatch)
    {
        Var result;
        if (obj->InvokeBuiltInOperationRemotely(EntryGetOwnPropertyDescriptors, args, &result))
        {
            return result;
        }
    }

    JavascriptArray* ownPropertyKeys = JavascriptOperators::GetOwnPropertyKeys(obj, scriptContext);
    RecyclableObject* resultObj = scriptContext->GetLibrary()->CreateObject(true, (Js::PropertyIndex) ownPropertyKeys->GetLength());

    PropertyDescriptor propDesc;
    Var propKey = nullptr;

    for (uint i = 0; i < ownPropertyKeys->GetLength(); i++)
    {
        BOOL getPropResult = ownPropertyKeys->DirectGetItemAt(i, &propKey);
        Assert(getPropResult);

        if (!getPropResult)
        {
            continue;
        }

        PropertyRecord const * propertyRecord;
        JavascriptConversion::ToPropertyKey(propKey, scriptContext, &propertyRecord, nullptr);

        Var newDescriptor = JavascriptObject::GetOwnPropertyDescriptorHelper(obj, propKey, scriptContext);
        if (!JavascriptOperators::IsUndefined(newDescriptor))
        {
            resultObj->SetProperty(propertyRecord->GetPropertyId(), newDescriptor, PropertyOperation_None, nullptr);
        }
    }

    return resultObj;
}